

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O1

void dpf_cb(block input)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  
  _output_bit_to_bit(CONCAT44(in_XMM0_Db,in_XMM0_Da));
  _output_bit_to_bit(CONCAT44(in_XMM0_Db,in_XMM0_Dc));
  putchar(10);
  return;
}

Assistant:

void dpf_cb(block input) {
    uint64_t *val = (uint64_t *) &input;

	//printf("%016lx%016lx\n", val[0], val[1]);
	_output_bit_to_bit(val[0]);
	_output_bit_to_bit(val[1]);
	printf("\n");
}